

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

MainFunc __thiscall kj::TestRunner::getMain(TestRunner *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  undefined8 *in_RSI;
  MainFunc MVar2;
  StringPtr version;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr briefDescription;
  StringPtr argumentTitle;
  StringPtr helpText_01;
  StringPtr argumentTitle_00;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_138;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_128;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_118;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_108;
  MainBuilder local_f8;
  char *local_e8;
  undefined8 uStack_e0;
  char *local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 uStack_c0;
  OptionName local_b8;
  undefined1 local_a8;
  char *local_a0;
  OptionName local_98;
  undefined1 local_88;
  char *local_80;
  OptionName local_78;
  undefined1 local_68;
  char *local_60;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:163:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:163:27)>
  local_58;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:160:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:160:47)>
  local_48;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:157:35),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:157:35)>
  local_38;
  BoundMethod<kj::TestRunner_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:152:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_test_c__:152:44)>
  local_28;
  
  local_c8 = "";
  uStack_c0 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x28;
  version.content.ptr = "KJ Test Runner (version not applicable)";
  briefDescription.content.size_ = 0x4b;
  briefDescription.content.ptr =
       "Run all tests that have been linked into the binary with this test runner.";
  MainBuilder::MainBuilder
            (&local_f8,(ProcessContext *)*in_RSI,version,briefDescription,extendedDescription);
  local_78.isLong = false;
  local_78.field_1.shortName = 'f';
  local_68 = 1;
  local_60 = "filter";
  Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_108,&local_28);
  local_d8 = 
  "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  uStack_d0 = 0x11a;
  helpText.content.size_ = 0x11a;
  helpText.content.ptr =
       "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  names._M_len = 2;
  names._M_array = &local_78;
  argumentTitle.content.size_ = 0x10;
  argumentTitle.content.ptr = "<file>[:<line>]";
  pMVar1 = MainBuilder::addOptionWithArg
                     (&local_f8,names,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_108,
                      argumentTitle,helpText);
  local_98.isLong = false;
  local_98.field_1.shortName = 'l';
  local_88 = 1;
  local_80 = "list";
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_118,&local_38);
  names_00._M_len = 2;
  names_00._M_array = &local_98;
  helpText_01.content.size_ = 0x7b;
  helpText_01.content.ptr =
       "List all test cases that would run, but don\'t run them. If --filter is specified then only the match tests will be listed."
  ;
  pMVar1 = MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_118,
                      helpText_01);
  local_b8.isLong = false;
  local_b8.field_1.shortName = 'b';
  local_a8 = 1;
  local_a0 = "benchmark";
  Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_5_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_128,&local_48);
  local_e8 = 
  "Specifies that any benchmarks in the tests should run for <iters> iterations. If not specified, then count is 1, which simply tests that the benchmarks function."
  ;
  uStack_e0 = 0xa2;
  helpText_00.content.size_ = 0xa2;
  helpText_00.content.ptr =
       "Specifies that any benchmarks in the tests should run for <iters> iterations. If not specified, then count is 1, which simply tests that the benchmarks function."
  ;
  names_01._M_len = 2;
  names_01._M_array = &local_b8;
  argumentTitle_00.content.size_ = 8;
  argumentTitle_00.content.ptr = "<iters>";
  pMVar1 = MainBuilder::addOptionWithArg
                     (pMVar1,names_01,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_128,
                      argumentTitle_00,helpText_00);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_7_,kj::TestRunner::getMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_138,&local_58);
  MainBuilder::callAfterParsing(pMVar1,(Function<kj::MainBuilder::Validity_()> *)&local_138);
  MainBuilder::build((MainBuilder *)this);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_138);
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_128);
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_118);
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_108);
  MainBuilder::~MainBuilder(&local_f8);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

MainFunc getMain() {
    return MainBuilder(context, "KJ Test Runner (version not applicable)",
        "Run all tests that have been linked into the binary with this test runner.")
        .addOptionWithArg({'f', "filter"}, KJ_BIND_METHOD(*this, setFilter), "<file>[:<line>]",
            "Run only the specified test case(s). You may use a '*' wildcard in <file>. You may "
            "also omit any prefix of <file>'s path; test from all matching files will run. "
            "You may specify multiple filters; any test matching at least one filter will run. "
            "<line> may be a range, e.g. \"100-500\".")
        .addOption({'l', "list"}, KJ_BIND_METHOD(*this, setList),
            "List all test cases that would run, but don't run them. If --filter is specified "
            "then only the match tests will be listed.")
        .addOptionWithArg({'b', "benchmark"}, KJ_BIND_METHOD(*this, setBenchmarkIters), "<iters>",
            "Specifies that any benchmarks in the tests should run for <iters> iterations. "
            "If not specified, then count is 1, which simply tests that the benchmarks function.")
        .callAfterParsing(KJ_BIND_METHOD(*this, run))
        .build();
  }